

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void __thiscall
re2c::Node::cover<unsigned_short,unsigned_char>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  uint uVar1;
  rule_t rVar2;
  pointer ppvVar3;
  long lVar4;
  pointer puVar5;
  bool bVar6;
  size_t i;
  path_t *ppVar7;
  ulong uVar8;
  undefined2 *__ptr;
  _Base_ptr p_Var9;
  ulong uVar10;
  ulong uVar11;
  ulong count;
  undefined2 *puVar12;
  undefined2 *puVar13;
  ulong len;
  size_t buffer_size;
  path_t new_prefix;
  
  bVar6 = end(this);
  ppVar7 = this->suffix;
  if (bVar6) {
    if (ppVar7 == (path_t *)0x0) {
      ppVar7 = (path_t *)operator_new(0x38);
      rVar2 = this->rule;
      bVar6 = this->ctx;
      (ppVar7->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ppVar7->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (ppVar7->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVar7->rule = rVar2;
      ppVar7->rule_pos = 0;
      ppVar7->ctx = bVar6;
      ppVar7->ctx_pos = 0;
      this->suffix = ppVar7;
    }
  }
  else if (ppVar7 == (path_t *)0x0) {
    if (1 < this->loop) {
      return;
    }
    this->loop = this->loop + 1;
    p_Var9 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (((_Rb_tree_header *)p_Var9 != &(this->arcs)._M_t._M_impl.super__Rb_tree_header &&
           (size->value != 0x40000000))) {
      path_t::path_t(&new_prefix,prefix);
      path_t::extend(&new_prefix,*(rule_t *)(*(long *)(p_Var9 + 1) + 100),
                     *(bool *)(*(long *)(p_Var9 + 1) + 0x6c),(arc_t *)&p_Var9[1]._M_parent);
      cover<unsigned_short,unsigned_char>(*(Node **)(p_Var9 + 1),&new_prefix,input,keys,size);
      if ((*(long *)(*(long *)(p_Var9 + 1) + 0xa8) != 0) && (this->suffix == (path_t *)0x0)) {
        ppVar7 = (path_t *)operator_new(0x38);
        rVar2 = this->rule;
        bVar6 = this->ctx;
        (ppVar7->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (ppVar7->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (ppVar7->arcs).
        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppVar7->rule = rVar2;
        ppVar7->rule_pos = 0;
        ppVar7->ctx = bVar6;
        ppVar7->ctx_pos = 0;
        this->suffix = ppVar7;
        path_t::extend(ppVar7,*(rule_t *)(*(long *)(p_Var9 + 1) + 100),
                       *(bool *)(*(long *)(p_Var9 + 1) + 0x6c),(arc_t *)&p_Var9[1]._M_parent);
        path_t::append(this->suffix,*(path_t **)(*(long *)(p_Var9 + 1) + 0xa8));
      }
      std::
      _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)&new_prefix);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    }
    this->loop = this->loop + 0xff;
    return;
  }
  path_t::append(prefix,ppVar7);
  uVar1 = size->value;
  ppvVar3 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  len = (long)(prefix->arcs).
              super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3;
  count = 0;
  for (uVar8 = 0; len != uVar8; uVar8 = uVar8 + 1) {
    uVar11 = (long)*(pointer *)
                    ((long)&(ppvVar3[uVar8]->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    + 8) -
             *(long *)&(ppvVar3[uVar8]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl >> 2
    ;
    if (count <= uVar11) {
      count = uVar11;
    }
  }
  uVar8 = 0x40000000;
  if (len < 0x40000000) {
    uVar8 = len;
  }
  uVar11 = 0x40000000;
  if (count < 0x40000000) {
    uVar11 = count;
  }
  uVar11 = uVar11 * uVar8;
  uVar8 = 0x40000000;
  if (uVar11 < 0x40000000) {
    __ptr = (undefined2 *)operator_new__(uVar11 * 2);
    puVar12 = __ptr;
    for (uVar8 = 0; uVar8 != len; uVar8 = uVar8 + 1) {
      lVar4 = *(long *)&(ppvVar3[uVar8]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
      puVar5 = *(pointer *)
                ((long)&(ppvVar3[uVar8]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl + 8
                );
      puVar13 = puVar12;
      for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
        *puVar13 = *(undefined2 *)(lVar4 + (uVar10 % (ulong)((long)puVar5 - lVar4 >> 2)) * 4);
        puVar13 = puVar13 + len;
      }
      puVar12 = puVar12 + 1;
    }
    fwrite(__ptr,2,uVar11,(FILE *)input);
    operator_delete__(__ptr);
    keygen<unsigned_char>
              (keys,count,len,(&prefix->rule_pos)[(ulong)(prefix->rule).restorectx * 2],
               (rule_rank_t)(prefix->rule).rank.value);
    uVar8 = uVar11;
  }
  uVar8 = uVar8 + uVar1;
  if (0x3fffffff < uVar8) {
    uVar8 = 0x40000000;
  }
  size->value = (uint32_t)uVar8;
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}